

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O0

vector<PointData,_std::allocator<PointData>_> * __thiscall
Harris::GetMaximaPoints
          (vector<PointData,_std::allocator<PointData>_> *__return_storage_ptr__,Harris *this,
          float percentage,int filterRange,int suppressionRadius)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  iterator iVar5;
  iterator iVar6;
  size_type sVar7;
  reference pvVar8;
  int *piVar9;
  int sy;
  int sx;
  int c_1;
  int r_1;
  int supCols;
  int supRows;
  int i;
  int numberTopPoints;
  undefined1 local_e8 [8];
  PointData d;
  Point_<int> local_d0;
  Point p;
  int c;
  int r;
  vector<PointData,_std::allocator<PointData>_> points;
  Mat local_88 [8];
  Mat maximaSuppressionMat;
  int suppressionRadius_local;
  int filterRange_local;
  float percentage_local;
  Harris *this_local;
  vector<PointData,_std::allocator<PointData>_> *topPoints;
  
  iVar1 = *(int *)&this->field_0x8;
  iVar2 = *(int *)&this->field_0xc;
  cv::Scalar_<double>::all
            ((Scalar_<double> *)
             &points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0);
  cv::Mat::Mat(local_88,iVar1,iVar2,5,
               (Scalar_ *)
               &points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::vector<PointData,_std::allocator<PointData>_>::vector
            ((vector<PointData,_std::allocator<PointData>_> *)&c);
  for (p.y = 0; p.y < *(int *)&this->field_0x8; p.y = p.y + 1) {
    for (p.x = 0; p.x < *(int *)&this->field_0xc; p.x = p.x + 1) {
      cv::Point_<int>::Point_(&local_d0,p.y,p.x);
      PointData::PointData((PointData *)local_e8);
      pfVar4 = cv::Mat::at<float>(&this->harrisResponses,p.y,p.x);
      local_e8._0_4_ = *pfVar4;
      cv::Point_<int>::operator=((Point_<int> *)(local_e8 + 4),&local_d0);
      std::vector<PointData,_std::allocator<PointData>_>::push_back
                ((vector<PointData,_std::allocator<PointData>_> *)&c,(value_type *)local_e8);
    }
  }
  iVar5 = std::vector<PointData,_std::allocator<PointData>_>::begin
                    ((vector<PointData,_std::allocator<PointData>_> *)&c);
  iVar6 = std::vector<PointData,_std::allocator<PointData>_>::end
                    ((vector<PointData,_std::allocator<PointData>_> *)&c);
  std::
  sort<__gnu_cxx::__normal_iterator<PointData*,std::vector<PointData,std::allocator<PointData>>>,CornerResponse>
            (iVar5._M_current,iVar6._M_current);
  iVar1 = *(int *)&this->field_0xc;
  iVar2 = *(int *)&this->field_0x8;
  std::vector<PointData,_std::allocator<PointData>_>::vector(__return_storage_ptr__);
  for (supCols = 0;
      (sVar7 = std::vector<PointData,_std::allocator<PointData>_>::size(__return_storage_ptr__),
      sVar7 < (ulong)(long)(int)((float)(iVar1 * iVar2) * percentage) &&
      (sVar7 = std::vector<PointData,_std::allocator<PointData>_>::size
                         ((vector<PointData,_std::allocator<PointData>_> *)&c),
      (long)supCols != sVar7)); supCols = supCols + 1) {
    pvVar8 = std::vector<PointData,_std::allocator<PointData>_>::operator[]
                       ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
    iVar3 = (pvVar8->point).x;
    pvVar8 = std::vector<PointData,_std::allocator<PointData>_>::operator[]
                       ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
    piVar9 = cv::Mat::at<int>(local_88,iVar3,(pvVar8->point).y);
    if (*piVar9 == 0) {
      for (sx = -suppressionRadius; sx <= suppressionRadius; sx = sx + 1) {
        for (sy = -suppressionRadius; sy <= suppressionRadius; sy = sy + 1) {
          std::vector<PointData,_std::allocator<PointData>_>::operator[]
                    ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
          std::vector<PointData,_std::allocator<PointData>_>::operator[]
                    ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
          pvVar8 = std::vector<PointData,_std::allocator<PointData>_>::operator[]
                             ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
          iVar3 = (pvVar8->point).x;
          pvVar8 = std::vector<PointData,_std::allocator<PointData>_>::operator[]
                             ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
          piVar9 = cv::Mat::at<int>(local_88,iVar3 + sy,(pvVar8->point).y + sx);
          *piVar9 = 1;
        }
      }
      pvVar8 = std::vector<PointData,_std::allocator<PointData>_>::operator[]
                         ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
      (pvVar8->point).x = filterRange + 1 + (pvVar8->point).x;
      pvVar8 = std::vector<PointData,_std::allocator<PointData>_>::operator[]
                         ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
      (pvVar8->point).y = filterRange + 1 + (pvVar8->point).y;
      pvVar8 = std::vector<PointData,_std::allocator<PointData>_>::operator[]
                         ((vector<PointData,_std::allocator<PointData>_> *)&c,(long)supCols);
      std::vector<PointData,_std::allocator<PointData>_>::push_back(__return_storage_ptr__,pvVar8);
    }
  }
  std::vector<PointData,_std::allocator<PointData>_>::~vector
            ((vector<PointData,_std::allocator<PointData>_> *)&c);
  cv::Mat::~Mat(local_88);
  return __return_storage_ptr__;
}

Assistant:

vector<PointData> Harris::GetMaximaPoints(float percentage, int filterRange, int suppressionRadius) {
    // Declare a max suppression matrix
    Mat maximaSuppressionMat(harrisResponses.rows, harrisResponses.cols, CV_32F, Scalar::all(0));

    // Create a vector of all Points
    std::vector<PointData> points;
    for (int r = 0; r < harrisResponses.rows; r++) {
        for (int c = 0; c < harrisResponses.cols; c++) {
            Point p(r,c); 

            PointData d;
            d.cornerResponse = harrisResponses.at<float>(r,c);
            d.point = p;

            points.push_back(d);
        }
    }

    // Sort points by corner Response
    sort(points.begin(), points.end(), CornerResponse());

    // Get top points, given by the percentage
    int numberTopPoints = harrisResponses.cols * harrisResponses.rows * percentage;
    std::vector<PointData> topPoints;

    int i=0;
    while(topPoints.size() < numberTopPoints) {
        if(i == points.size())
            break;

        int supRows = maximaSuppressionMat.rows;
        int supCols = maximaSuppressionMat.cols;

        // Check if point marked in maximaSuppression matrix
        if(maximaSuppressionMat.at<int>(points[i].point.x,points[i].point.y) == 0) {
            for (int r = -suppressionRadius; r <= suppressionRadius; r++) {
                for (int c = -suppressionRadius; c <= suppressionRadius; c++) {
                    int sx = points[i].point.x+c;
                    int sy = points[i].point.y+r;

                    // bound checking
                    if(sx > supRows)
                        sx = supRows;
                    if(sx < 0)
                        sx = 0;
                    if(sy > supCols)
                        sy = supCols;
                    if(sy < 0)
                        sy = 0;

                    maximaSuppressionMat.at<int>(points[i].point.x+c, points[i].point.y+r) = 1;
                }
            }

            // Convert back to original image coordinate system 
            points[i].point.x += 1 + filterRange;
            points[i].point.y += 1 + filterRange;
            topPoints.push_back(points[i]);
        }

        i++;
    }

    return topPoints;
}